

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

void __thiscall QTextDocument::setPlainText(QTextDocument *this,QString *text)

{
  bool enable;
  int iVar1;
  QTextDocumentPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextDocumentPrivate **)&this->field_0x8;
  enable = this_00->undoEnabled;
  QTextDocumentPrivate::enableUndoRedo(this_00,false);
  iVar1 = this_00->editBlock;
  this_00->editBlock = iVar1 + 1;
  if (iVar1 == 0) {
    this_00->revision = this_00->revision + 1;
  }
  QTextDocumentPrivate::clear(this_00);
  QTextCursor::QTextCursor(&QStack_38,this);
  QTextCursor::insertText(&QStack_38,text);
  QTextCursor::~QTextCursor(&QStack_38);
  QTextDocumentPrivate::endEditBlock(this_00);
  QTextDocumentPrivate::enableUndoRedo(this_00,enable);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setPlainText(const QString &text)
{
    Q_D(QTextDocument);
    bool previousState = d->isUndoRedoEnabled();
    d->enableUndoRedo(false);
    d->beginEditBlock();
    d->clear();
    QTextCursor(this).insertText(text);
    d->endEditBlock();
    d->enableUndoRedo(previousState);
}